

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O0

RDL_URFinfo * RDL_initUrfInfo(RDL_cfURF *RCFs,RDL_graph *graph)

{
  RDL_URFinfo *pRVar1;
  uint *puVar2;
  char ***pppcVar3;
  char **ppcVar4;
  char *pcVar5;
  uint local_4c;
  uint local_48;
  uint currIdx;
  uint currWeight;
  uint k;
  uint j;
  uint i;
  uint *numOfProtos;
  uint numOfWeights;
  char ***URFrel;
  RDL_URFinfo *urfInfo;
  RDL_graph *graph_local;
  RDL_cfURF *RCFs_local;
  
  numOfProtos._4_4_ = 1;
  pRVar1 = (RDL_URFinfo *)malloc(0x30);
  local_48 = (*RCFs->fams)->weight;
  for (k = 0; k < RCFs->nofFams; k = k + 1) {
    if (RCFs->fams[k]->weight != local_48) {
      numOfProtos._4_4_ = numOfProtos._4_4_ + 1;
      local_48 = RCFs->fams[k]->weight;
    }
  }
  puVar2 = (uint *)malloc((ulong)numOfProtos._4_4_ << 2);
  for (k = 0; k < numOfProtos._4_4_; k = k + 1) {
    puVar2[k] = 0;
  }
  local_48 = (*RCFs->fams)->weight;
  local_4c = 0;
  for (k = 0; k < RCFs->nofFams; k = k + 1) {
    if (RCFs->fams[k]->weight != local_48) {
      local_4c = local_4c + 1;
      local_48 = RCFs->fams[k]->weight;
    }
    puVar2[local_4c] = puVar2[local_4c] + 1;
  }
  pppcVar3 = (char ***)malloc((ulong)numOfProtos._4_4_ << 3);
  for (k = 0; k < numOfProtos._4_4_; k = k + 1) {
    ppcVar4 = (char **)malloc((ulong)puVar2[k] << 3);
    pppcVar3[k] = ppcVar4;
    pcVar5 = (char *)malloc((ulong)(puVar2[k] * puVar2[k]));
    *pppcVar3[k] = pcVar5;
    for (currWeight = 1; currWeight < puVar2[k]; currWeight = currWeight + 1) {
      pppcVar3[k][currWeight] = pppcVar3[k][currWeight - 1] + puVar2[k];
    }
  }
  for (k = 0; k < numOfProtos._4_4_; k = k + 1) {
    for (currWeight = 0; currWeight < puVar2[k]; currWeight = currWeight + 1) {
      for (currIdx = 0; currIdx < puVar2[k]; currIdx = currIdx + 1) {
        pppcVar3[k][currWeight][currIdx] = '\0';
      }
    }
  }
  pRVar1->nofWeights = numOfProtos._4_4_;
  pRVar1->nofProtos = puVar2;
  pRVar1->URFrel = pppcVar3;
  return pRVar1;
}

Assistant:

RDL_URFinfo *RDL_initUrfInfo(RDL_cfURF *RCFs, RDL_graph *graph)
{
  RDL_URFinfo *urfInfo;
  char ***URFrel;
  unsigned numOfWeights = 1;
  unsigned *numOfProtos;
  unsigned i, j, k, currWeight, currIdx;
  urfInfo = malloc(sizeof(*urfInfo));

  /* count number of different weights occuring*/
  currWeight = RCFs->fams[0]->weight;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++numOfWeights;
      currWeight = RCFs->fams[i]->weight;
    }
  }

  /* for each weight count number of different prototypes */
  numOfProtos = malloc(numOfWeights * sizeof(*numOfProtos));
  for(i=0; i<numOfWeights; ++i)
  {
    numOfProtos[i] = 0;
  }
  currWeight = RCFs->fams[0]->weight;
  currIdx = 0;
  for(i=0; i<RCFs->nofFams; ++i)
  {
    if(RCFs->fams[i]->weight != currWeight)
    {
      ++currIdx;
      currWeight = RCFs->fams[i]->weight;
    }
    ++numOfProtos[currIdx];
  }

   /*allocate everything*/
  URFrel = malloc(numOfWeights * sizeof(*URFrel));
  for(i=0; i<numOfWeights; ++i)
  {
    URFrel[i] = malloc(numOfProtos[i] * sizeof(*URFrel[i]));
    *URFrel[i] = malloc(numOfProtos[i] * numOfProtos[i] * sizeof(**URFrel[i]));
    for(j=1; j<numOfProtos[i]; ++j)
    {
      URFrel[i][j] = URFrel[i][j-1] + numOfProtos[i];
    }
  }

  /*initialize with zeros*/
  for(i=0; i<numOfWeights; ++i)
  {
    for(j=0; j<numOfProtos[i]; ++j)
    {
      for(k=0; k<numOfProtos[i]; ++k)
      {
        URFrel[i][j][k] = 0;
      }
    }
  }

  urfInfo->nofWeights = numOfWeights;
  urfInfo->nofProtos = numOfProtos;
  urfInfo->URFrel = URFrel;

  return urfInfo;
}